

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsOutput::external(SmodelsOutput *this,Atom_t a,Value_t t)

{
  uint uVar1;
  SmodelsOutput *pSVar2;
  SmodelsOutput *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  uint uVar3;
  Value_t local_4;
  
  uVar3 = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if ((in_RDI->ext_ & 1U) == 0) {
    fail(-2,"virtual void Potassco::SmodelsOutput::external(Atom_t, Value_t)",0x15b,"ext_",
         "external directive not supported in smodels format",0);
  }
  uVar1 = Value_t::operator_cast_to_unsigned_int(&local_4);
  if (uVar1 == 3) {
    startRule(in_RDI,uVar3);
    add(in_RDI,uVar3);
    endRule(in_RDI);
  }
  else {
    startRule(in_RDI,uVar3);
    pSVar2 = add(in_RDI,uVar3);
    uVar3 = (uint)((ulong)pSVar2 >> 0x20);
    Value_t::operator_cast_to_unsigned_int(&local_4);
    add(in_RDI,uVar3);
    endRule(in_RDI);
  }
  return;
}

Assistant:

void SmodelsOutput::external(Atom_t a, Value_t t) {
	POTASSCO_REQUIRE(ext_, "external directive not supported in smodels format");
	if (t != Value_t::Release) {
		startRule(ClaspAssignExt).add(a).add((unsigned(t)^3)-1).endRule();
	}
	else {
		startRule(ClaspReleaseExt).add(a).endRule();
	}
}